

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SteppingZomby.cpp
# Opt level: O1

void anon_unknown.dwarf_9ae1::doSomething(Listener *listener,string *callingFunctionName)

{
  pointer pcVar1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  int *piVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  timespec local_70;
  uint local_60;
  undefined4 uStack_5c;
  _Atomic_word _Stack_58;
  _Atomic_word _Stack_54;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pcVar1 = (callingFunctionName->_M_dataplus)._M_p;
  local_70.tv_sec = (__time_t)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + callingFunctionName->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_38->_M_use_count = 1;
  local_38->_M_weak_count = 1;
  local_38->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00106bf0;
  local_40 = local_38 + 1;
  p_Var4 = local_38 + 2;
  local_38[1]._vptr__Sp_counted_base = (_func_int **)p_Var4;
  if ((uint *)local_70.tv_sec == &local_60) {
    *(uint *)&p_Var4->_vptr__Sp_counted_base = local_60;
    *(undefined4 *)((long)&local_38[2]._vptr__Sp_counted_base + 4) = uStack_5c;
    local_38[2]._M_use_count = _Stack_58;
    local_38[2]._M_weak_count = _Stack_54;
  }
  else {
    local_40->_vptr__Sp_counted_base = (_func_int **)local_70.tv_sec;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)CONCAT44(uStack_5c,local_60);
  }
  local_38[1]._M_use_count = (undefined4)local_70.tv_nsec;
  local_38[1]._M_weak_count = local_70.tv_nsec._4_4_;
  local_70.tv_nsec = 0;
  local_60 = local_60 & 0xffffff00;
  local_70.tv_sec = (__time_t)&local_60;
  (*listener->_vptr_Listener[2])(listener);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if ((uint *)local_70.tv_sec != &local_60) {
    operator_delete((void *)local_70.tv_sec,CONCAT44(uStack_5c,local_60) + 1);
  }
  local_70.tv_sec = 1;
  local_70.tv_nsec = 0;
  do {
    iVar2 = nanosleep(&local_70,&local_70);
    if (iVar2 != -1) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  pcVar1 = (callingFunctionName->_M_dataplus)._M_p;
  local_70.tv_sec = (__time_t)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + callingFunctionName->_M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  local_48->_M_use_count = 1;
  local_48->_M_weak_count = 1;
  local_48->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00106bf0;
  local_50 = local_48 + 1;
  p_Var4 = local_48 + 2;
  local_48[1]._vptr__Sp_counted_base = (_func_int **)p_Var4;
  if ((uint *)local_70.tv_sec == &local_60) {
    *(uint *)&p_Var4->_vptr__Sp_counted_base = local_60;
    *(undefined4 *)((long)&local_48[2]._vptr__Sp_counted_base + 4) = uStack_5c;
    local_48[2]._M_use_count = _Stack_58;
    local_48[2]._M_weak_count = _Stack_54;
  }
  else {
    local_50->_vptr__Sp_counted_base = (_func_int **)local_70.tv_sec;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)CONCAT44(uStack_5c,local_60);
  }
  local_48[1]._M_use_count = (undefined4)local_70.tv_nsec;
  local_48[1]._M_weak_count = local_70.tv_nsec._4_4_;
  local_70.tv_nsec = 0;
  local_60 = local_60 & 0xffffff00;
  local_70.tv_sec = (__time_t)&local_60;
  (*listener->_vptr_Listener[2])(listener);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if ((uint *)local_70.tv_sec != &local_60) {
    operator_delete((void *)local_70.tv_sec,CONCAT44(uStack_5c,local_60) + 1);
  }
  return;
}

Assistant:

void doSomething(Common::Listener& listener, std::string&& callingFunctionName)
{
    listener.processData(std::make_shared<Common::Listener::Data>(callingFunctionName + " started\n"));
    std::this_thread::sleep_for(std::chrono::milliseconds(1000));
    listener.processData(std::make_shared<Common::Listener::Data>(callingFunctionName + " finished\n"));
}